

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::comparison(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Parser *in_RSI;
  ptr<Expression> pVar5;
  undefined1 local_49;
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  shared_ptr<GreaterThan> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  term(this);
  bVar3 = match(in_RSI,LThan);
  if (bVar3) {
    consume(in_RSI);
    local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012fe80;
    local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1
         );
    local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012fed0;
    comparison((Parser *)&stack0xffffffffffffffe0);
    local_48._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<LessThan>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
               (shared_ptr<LessThan> *)&local_30,(shared_ptr<Expression> *)this,
               (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar3 = match(in_RSI,LThanEqu);
    if (bVar3) {
      consume(in_RSI);
      local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012ff40;
      local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
           1);
      local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012ff90;
      comparison((Parser *)&stack0xffffffffffffffe0);
      local_48._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<LessThanOrEqual>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                 (shared_ptr<LessThanOrEqual> *)&local_30,(shared_ptr<Expression> *)this,
                 (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      bVar3 = match(in_RSI,GThanEqu);
      if (bVar3) {
        consume(in_RSI);
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130000;
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 1);
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_00130050;
        comparison((Parser *)&stack0xffffffffffffffe0);
        local_48._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<GreaterThan>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                   &local_30,(shared_ptr<Expression> *)this,
                   (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        bVar3 = match(in_RSI,GThanEqu);
        _Var4._M_pi = extraout_RDX_02;
        if (!bVar3) goto LAB_0010f37e;
        consume(in_RSI);
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001300c0;
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 1);
        local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_00130110;
        comparison((Parser *)&stack0xffffffffffffffe0);
        local_48._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<GreaterThanOrEqual>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                   (shared_ptr<GreaterThanOrEqual> *)&local_30,(shared_ptr<Expression> *)this,
                   (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
  }
  _Var2._M_pi = a_Stack_40[0]._M_pi;
  _Var1._M_p = local_48._M_p;
  local_48._M_p = (pointer)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
  (this->filepath)._M_dataplus._M_p = _Var1._M_p;
  (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_04;
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      _Var4._M_pi = extraout_RDX_05;
    }
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<GreaterThan,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var4._M_pi = extraout_RDX_07;
  }
LAB_0010f37e:
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::comparison() {
    ptr<Expression> expr = term();

    if(match(TokenType::LThan)) {
        consume();
        expr = make<BinaryOperator>(make<LessThan>(), expr, comparison());
    } else if(match(TokenType::LThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<LessThanOrEqual>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThan>(), expr, comparison());
    } else if(match(TokenType::GThanEqu)) {
        consume();
        expr = make<BinaryOperator>(make<GreaterThanOrEqual>(), expr, comparison());
    }

    return expr;
}